

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

Image * rw::gl3::rasterToImage(Raster *raster)

{
  FILE *pFVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  uint8 *rasrow;
  uint8 *imgrow;
  int y;
  int x;
  uint8 *pixels;
  uint8 *imgpixels;
  uint8 *out;
  uint8 *in;
  Error _e_2;
  Error _e_1;
  _func_void_uint8_ptr_uint8_ptr *conv;
  Error _e;
  Gl3Raster *natras;
  bool unlock;
  Image *image;
  int32 depth;
  Raster *raster_local;
  
  bVar4 = raster->pixels == (uint8 *)0x0;
  if (bVar4) {
    Raster::lock(raster,0,2);
  }
  _e = (Error)((long)&raster->platform + (long)nativeRasterOffset);
  if ((*(byte *)((long)_e + 0x14) & 1) != 0) {
    conv._0_4_ = 0xb00;
    conv._4_4_ = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp",
            0x2ec);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x8000000a);
    fprintf(pFVar1,"%s\n",pcVar3);
    setError((Error *)&conv);
    return (Image *)0x0;
  }
  uVar2 = raster->format & 0xf00;
  if (uVar2 == 0x100) {
    image._4_4_ = 0x10;
    _e_1 = (Error)conv_ARGB1555_from_RGBA5551;
  }
  else {
    if (((uVar2 == 0x200) || (uVar2 == 0x300)) || (uVar2 == 0x400)) {
LAB_00125d8b:
      _e_2.plugin = 0xb00;
      _e_2.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp",
              0x304);
      pFVar1 = _stderr;
      pcVar3 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar3);
      setError(&_e_2);
      return (Image *)0x0;
    }
    if (uVar2 == 0x500) {
      image._4_4_ = 0x20;
      _e_1 = (Error)conv_RGBA8888_from_RGBA8888;
    }
    else {
      if (uVar2 != 0x600) goto LAB_00125d8b;
      image._4_4_ = 0x18;
      _e_1 = (Error)conv_RGB888_from_RGB888;
    }
  }
  if (((raster->format & 0x4000U) == 0) && ((raster->format & 0x2000U) == 0)) {
    raster_local = (Raster *)Image::create(raster->width,raster->height,image._4_4_);
    Image::allocate((Image *)raster_local);
    pixels = *(uint8 **)&raster_local->height + (raster_local->flags + -1) * raster_local->width;
    for (imgrow._0_4_ = 0; (int)imgrow < raster_local->flags; imgrow._0_4_ = (int)imgrow + 1) {
      rasrow = pixels;
      for (imgrow._4_4_ = 0; imgrow._4_4_ < raster_local->type; imgrow._4_4_ = imgrow._4_4_ + 1) {
        (*(code *)_e_1)(rasrow);
        rasrow = rasrow + raster_local->format;
      }
      pixels = pixels + -(long)raster_local->width;
    }
    if (bVar4) {
      Raster::unlock(raster,0);
    }
  }
  else {
    in._0_4_ = 0xb00;
    in._4_4_ = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp",
            0x30a);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x8000000a);
    fprintf(pFVar1,"%s\n",pcVar3);
    setError((Error *)&in);
    raster_local = (Raster *)0x0;
  }
  return (Image *)raster_local;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	if(natras->isCompressed){
		// TODO
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	void (*conv)(uint8 *out, uint8 *in) = nil;
	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		conv = conv_ARGB1555_from_RGBA5551;
		break;
	case Raster::C8888:
		depth = 32;
		conv = conv_RGBA8888_from_RGBA8888;
		break;
	case Raster::C888:
		depth = 24;
		conv = conv_RGB888_from_RGB888;
		break;

	default:
	case Raster::C555:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	if(raster->format & Raster::PAL4 ||
	   raster->format & Raster::PAL8){
		RWERROR((ERR_INVRASTER));
		return nil;
	}
		
	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;
	uint8 *pixels = raster->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(imgrow, rasrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}

	if(unlock)
		raster->unlock(0);

	return image;
}